

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

int run_test_fork_timer(void)

{
  __pid_t child_pid;
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  run_timer_loop_once();
  child_pid = fork();
  if (child_pid == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_fork(uVar2);
    if (iVar1 != 0) {
      pcVar3 = "0 == uv_loop_fork(uv_default_loop())";
      uStack_10 = 0x6e;
      goto LAB_00117854;
    }
    run_timer_loop_once();
  }
  else {
    if (child_pid == -1) {
      pcVar3 = "child_pid != -1";
      uStack_10 = 0x67;
      goto LAB_00117854;
    }
    assert_wait_child(child_pid);
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 == 0) {
    return 0;
  }
  pcVar3 = "0 == uv_loop_close(uv_default_loop())";
  uStack_10 = 0x72;
LAB_00117854:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fork_timer) {
  /* Timers continue to work after we fork. */

  /*
   * Establish the loop before we fork to make sure that it
   * has state to get reset after the fork.
   */
  pid_t child_pid;

  run_timer_loop_once();
  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    assert_wait_child(child_pid);
  } else {
    /* child */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    run_timer_loop_once();
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}